

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O3

err_t belsShare(octet *si,size_t count,size_t threshold,size_t len,octet *s,octet *m0,octet *mi,
               gen_i rng,void *rng_state)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  u64 *dest;
  word *b;
  word *c;
  err_t eVar4;
  ulong m;
  size_t n;
  u64 *dest_00;
  size_t n_00;
  
  if (rng == (gen_i)0x0) {
    eVar4 = 0x130;
  }
  else {
    eVar4 = 0x6d;
    if ((threshold - 1 < count) && (len == 0x20 || (len & 0xfffffffffffffff7) == 0x10)) {
      bVar1 = memIsValid(s,len);
      if (bVar1 != 0) {
        bVar1 = memIsValid(m0,len);
        if (bVar1 != 0) {
          bVar1 = memIsValid(mi,len * count);
          if (bVar1 != 0) {
            bVar1 = memIsValid(si,len * count);
            if (bVar1 != 0) {
              m = len >> 3;
              n_00 = threshold * m;
              n = n_00 - m;
              sVar2 = ppMul_deep(n,m);
              sVar3 = ppMod_deep(n_00,m + 1);
              sVar2 = utilMax(2,sVar2,sVar3);
              dest = (u64 *)blobCreate(sVar2 + n_00 * 0x10 + 8);
              if (dest == (u64 *)0x0) {
                eVar4 = 0x6e;
              }
              else {
                dest_00 = (u64 *)((long)dest + len + 8);
                b = (word *)((long)dest + n_00 * 8 + len + 8);
                c = b + -m;
                sVar2 = (threshold - 1) * len;
                (*rng)(dest_00,sVar2,rng_state);
                u64From(dest_00,dest_00,sVar2);
                u64From(dest,m0,len);
                ppMul(c,dest_00,n,dest,m,c + n_00);
                wwXor2(b,dest_00,n);
                u64From(dest,s,len);
                wwXor2(c,dest,m);
                do {
                  u64From(dest,mi,len);
                  *(undefined8 *)((long)dest + len) = 1;
                  ppMod(dest,c,n_00,dest,m + 1,c + n_00);
                  u64To(si,len,dest);
                  si = si + len;
                  mi = mi + len;
                  count = count - 1;
                } while (count != 0);
                blobClose(dest);
                eVar4 = 0;
              }
            }
          }
        }
      }
    }
  }
  return eVar4;
}

Assistant:

err_t belsShare(octet si[], size_t count, size_t threshold, size_t len, 
	const octet s[], const octet m0[], const octet mi[], 
	gen_i rng, void* rng_state)
{
	size_t n, i;
	void* state;
	word* f;
	word* k;
	word* c;
	void* stack;
	// проверить генератор
	if (rng == 0)
		return ERR_BAD_RNG;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || 
		threshold == 0 || count < threshold ||
		!memIsValid(s, len) || !memIsValid(m0, len) || 
		!memIsValid(mi, len * count) || !memIsValid(si, count * len))
		return ERR_BAD_INPUT;
	EXPECT(belsValM(m0, len) == ERR_OK);
	// создать состояние
	n = W_OF_O(len);
	state = blobCreate(O_OF_W(2 * threshold * n + 1) + 
		utilMax(2, 
			ppMul_deep(threshold * n - n, n),
			ppMod_deep(threshold * n, n + 1)));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f = (word*)state;
	k = f + n + 1;
	c = k + threshold * n - n;
	stack = c + threshold * n;
	// сгенерировать k
	rng(k, threshold * len - len, rng_state);
	wwFrom(k, k, threshold * len - len);
	// c(x) <- (x^l + m0(x))k(x) + s(x)
	wwFrom(f, m0, len);
	ppMul(c, k, threshold * n - n, f, n, stack);
	wwXor2(c + n, k, threshold * n - n);
	wwFrom(f, s, len);
	wwXor2(c, f, n);
	// цикл по пользователям
	for (i = 0; i < count; ++i)
	{
		// f(x) <- x^l + mi(x)
		EXPECT(belsValM(mi + i * len, len) == ERR_OK);
		wwFrom(f, mi + i * len, len);
		f[n] = 1;
		// si(x) <- c(x) mod f(x)
		ppMod(f, c, threshold * n, f, n + 1, stack);
		wwTo(si + i * len, len, f);
	}
	// завершение
	blobClose(state);
	return ERR_OK;
}